

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O0

ON_AngleValue *
ON_AngleValue::Create
          (ON_AngleValue *__return_storage_ptr__,double angle_value,
          AngleUnitSystem angle_unit_system,uint locale_id,StringFormat string_format)

{
  double dVar1;
  double dVar2;
  undefined8 uVar3;
  bool bVar4;
  wchar_t *pwVar5;
  ON_AngleUnitName OVar6;
  double local_88;
  double denominator;
  double numerator;
  double proper;
  double sign;
  undefined1 local_58 [8];
  ON_AngleUnitName name;
  undefined1 local_40 [6];
  bool bClean;
  bool bFraction;
  ON_AngleValue rc;
  StringFormat string_format_local;
  uint locale_id_local;
  AngleUnitSystem angle_unit_system_local;
  double angle_value_local;
  
  rc.m_angle_as_string.m_s._7_1_ = string_format;
  ON_AngleValue((ON_AngleValue *)local_40);
  name.m_name._7_1_ = 0;
  name.m_name._6_1_ = 0;
  switch(rc.m_angle_as_string.m_s._7_1_) {
  case ExactDecimal:
    break;
  case ExactFraction:
    name.m_name._7_1_ = 1;
    break;
  case CleanDecimal:
    name.m_name._6_1_ = 1;
    break;
  case CleanFraction:
    name.m_name._6_1_ = 1;
    name.m_name._7_1_ = 1;
    break;
  default:
    rc.m_angle_as_string.m_s._7_1_ = ExactDecimal;
  }
  if (angle_unit_system == Unset) {
    ON_AngleValue(__return_storage_ptr__,&Unset);
    goto LAB_0085fd48;
  }
  bClean = (bool)angle_unit_system;
  rc._0_8_ = angle_value;
  OVar6 = ON_AngleUnitName::Create(locale_id,angle_unit_system,1.0 < angle_value);
  name._0_8_ = OVar6.m_name;
  local_58 = OVar6._0_8_;
  proper = ON_DBL_QNAN;
  numerator = ON_DBL_QNAN;
  denominator = ON_DBL_QNAN;
  local_88 = ON_DBL_QNAN;
  if ((name.m_name._7_1_ & 1) == 0) {
LAB_0085fc61:
    name._0_8_ = OVar6.m_name;
    local_58 = OVar6._0_8_;
    bVar4 = ON_AngleUnitName::AngleUnitNameIsNotEmpty((ON_AngleUnitName *)local_58);
    uVar3 = rc._0_8_;
    if (bVar4) {
      pwVar5 = ON_AngleUnitName::AngleUnitName((ON_AngleUnitName *)local_58);
      ON_wString::Format((ON_wString *)&rc.m_angle,L"%0.17g %ls",uVar3,pwVar5);
    }
    else {
      ON_wString::Format((ON_wString *)&rc.m_angle,L"%0.17g",rc._0_8_);
    }
  }
  else {
    bVar4 = ON_IsAnnotationFractionNumber
                      ((double)rc._0_8_,true,&proper,&numerator,&denominator,&local_88);
    OVar6.m_name = (wchar_t *)name._0_8_;
    OVar6.m_locale_id = local_58._0_4_;
    OVar6.m_angle_unit_system = local_58[4];
    OVar6.m_bNameIsSingular = (bool)local_58[5];
    OVar6.m_bNameIsPlural = (bool)local_58[6];
    OVar6._7_1_ = local_58[7];
    if (!bVar4) goto LAB_0085fc61;
    rc._0_8_ = (proper * denominator) / local_88;
    bVar4 = ON_AngleUnitName::AngleUnitNameIsNotEmpty((ON_AngleUnitName *)local_58);
    dVar2 = denominator;
    dVar1 = local_88;
    if (bVar4) {
      pwVar5 = ON_AngleUnitName::AngleUnitName((ON_AngleUnitName *)local_58);
      ON_wString::Format((ON_wString *)&rc.m_angle,L"%0.17g/%0.17g %ls",dVar2,dVar1,pwVar5);
    }
    else {
      ON_wString::Format((ON_wString *)&rc.m_angle,L"%0.17g/%0.17g",denominator,local_88);
    }
  }
  local_40[4] = None;
  local_40._0_4_ = ON_AngleUnitName::LocaleId((ON_AngleUnitName *)local_58);
  ON_AngleValue(__return_storage_ptr__,(ON_AngleValue *)local_40);
LAB_0085fd48:
  ~ON_AngleValue((ON_AngleValue *)local_40);
  return __return_storage_ptr__;
}

Assistant:

ON_AngleValue ON_AngleValue::Create(
  double angle_value,
  ON::AngleUnitSystem angle_unit_system,
  unsigned int locale_id,
  ON_AngleValue::StringFormat string_format
)
{
  ON_AngleValue rc;
  for (;;)
  {
    bool bFraction = false;
    bool bClean = false;
    switch (string_format)
    {
    case ON_AngleValue::StringFormat::ExactDecimal:
      break;
    case ON_AngleValue::StringFormat::ExactFraction:
      bFraction = true;
      break;
    case ON_AngleValue::StringFormat::CleanDecimal:
      bClean = true;
      break;
    case ON_AngleValue::StringFormat::CleanFraction:
      bClean = true;
      bFraction = true;
      break;
    default:
      string_format = ON_AngleValue::StringFormat::ExactDecimal;
      break;
    }

    if (false == (angle_value == angle_value))
      break;
    if (ON::AngleUnitSystem::Unset == angle_unit_system)
      break;
    rc.m_angle = angle_value;
    rc.m_angle_unit_system = angle_unit_system;
    const ON_AngleUnitName name = ON_AngleUnitName::Create(locale_id, angle_unit_system, angle_value > 1.0);

    // DO NOT USE A "PRETTY" FORMAT!
    // It is critical that this string scan back to rc.m_angle exactly.
    double sign = ON_DBL_QNAN;
    double proper = ON_DBL_QNAN;
    double numerator = ON_DBL_QNAN;
    double denominator = ON_DBL_QNAN;
    if (
      bFraction 
      && ON_IsAnnotationFractionNumber(rc.m_angle, true, &sign, &proper, &numerator, &denominator)
      )
    {
      rc.m_angle = sign*numerator/denominator;
      if (name.AngleUnitNameIsNotEmpty() )
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g %ls", numerator, denominator, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g/%0.17g", numerator, denominator);
    }
    else
    {
      if (name.AngleUnitNameIsNotEmpty())
        rc.m_angle_as_string.Format(L"%0.17g %ls", rc.m_angle, name.AngleUnitName());
      else
        rc.m_angle_as_string.Format(L"%0.17g", rc.m_angle);
    }

    rc.m_context_length_unit_system = ON::LengthUnitSystem::None;
    rc.m_context_locale_id = name.LocaleId();

    return rc;
  }
  return ON_AngleValue::Unset;
}